

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_inttable_insert(upb_inttable *t,uintptr_t key,upb_value val,upb_Arena *a)

{
  byte *pbVar1;
  long *plVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  upb_tabent *puVar5;
  upb_key tabkey;
  int iVar6;
  ulong uVar7;
  long lVar8;
  upb_tabent *puVar9;
  long lVar10;
  ulong uVar11;
  lookupkey_t key_00;
  lookupkey_t key_01;
  upb_table new_table;
  
  if (key < t->array_size) {
    puVar4 = t->presence_mask;
    if ((puVar4[key >> 3] >> ((uint)key & 7) & 1) != 0) {
      __assert_fail("!upb_inttable_arrhas(t, key)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x2cf,
                    "_Bool upb_inttable_insert(upb_inttable *, uintptr_t, upb_value, upb_Arena *)");
    }
    t->array_count = t->array_count + 1;
    t->array[key].val = val.val;
    pbVar1 = puVar4 + (key >> 3);
    *pbVar1 = *pbVar1 | '\x01' << ((byte)key & 7);
  }
  else {
    uVar3 = (t->t).mask;
    if ((uVar3 - (uVar3 + 1 >> 3)) + 1 == (t->t).count) {
      iVar6 = init((EVP_PKEY_CTX *)&new_table);
      if ((char)iVar6 == '\0') {
        return false;
      }
      uVar7 = (ulong)((t->t).mask + 1);
      lVar10 = 1;
      lVar8 = 8;
      do {
        if (uVar7 + lVar10 == 1) goto LAB_002ed86b;
        puVar9 = (t->t).entries;
        lVar10 = lVar10 + -1;
        plVar2 = (long *)((long)&(puVar9->val).val + lVar8);
        lVar8 = lVar8 + 0x18;
      } while (*plVar2 == 0);
      uVar11 = -lVar10;
      if (uVar11 < uVar7) {
        do {
          puVar5 = (t->t).entries;
          tabkey = (upb_key)puVar5[uVar11].key.num;
          key_00.str.size = (size_t)puVar9;
          key_00.num = tabkey.num;
          insert(&new_table,key_00,tabkey,(upb_value)puVar5[uVar11].val.val,
                 (uint)((ulong)tabkey >> 0x20) ^ (uint)tabkey.num,inthash,inteql);
          uVar7 = (ulong)((t->t).mask + 1);
          lVar8 = uVar11 * 0x18 + 0x20;
          do {
            uVar11 = uVar11 + 1;
            if (uVar7 <= uVar11) goto LAB_002ed86b;
            puVar9 = (t->t).entries;
            plVar2 = (long *)((long)&(puVar9->val).val + lVar8);
            lVar8 = lVar8 + 0x18;
          } while (*plVar2 == 0);
        } while (uVar11 < uVar7);
      }
LAB_002ed86b:
      if ((t->t).count != new_table.count) {
        __assert_fail("t->t.count == new_table.count",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0x2e3,
                      "_Bool upb_inttable_insert(upb_inttable *, uintptr_t, upb_value, upb_Arena *)"
                     );
      }
      (t->t).entries = new_table.entries;
      (t->t).count = new_table.count;
      (t->t).mask = new_table.mask;
    }
    key_01.str.size = (size_t)inthash;
    key_01.num = key;
    insert(&t->t,key_01,(upb_key)key,val,(uint)(key >> 0x20) ^ (uint)key,inthash,inteql);
  }
  return true;
}

Assistant:

bool upb_inttable_insert(upb_inttable* t, uintptr_t key, upb_value val,
                         upb_Arena* a) {
  if (key < t->array_size) {
    UPB_ASSERT(!upb_inttable_arrhas(t, key));
    t->array_count++;
    mutable_array(t)[key] = val;
    ((uint8_t*)t->presence_mask)[key / 8] |= (1 << (key % 8));
  } else {
    if (isfull(&t->t)) {
      /* Need to resize the hash part, but we re-use the array part. */
      size_t i;
      upb_table new_table;

      if (!init(&new_table, _upb_log2_table_size(&t->t) + 1, a)) {
        return false;
      }

      for (i = begin(&t->t); i < upb_table_size(&t->t); i = next(&t->t, i)) {
        const upb_tabent* e = &t->t.entries[i];
        insert(&new_table, intkey(e->key.num), e->key, e->val, inthash(e->key),
               &inthash, &inteql);
      }

      UPB_ASSERT(t->t.count == new_table.count);

      t->t = new_table;
    }
    upb_key tabkey = {.num = key};
    insert(&t->t, intkey(key), tabkey, val, upb_inthash(key), &inthash,
           &inteql);
  }
  check(t);
  return true;
}